

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::reset_controllers(Renderer *this,int c)

{
  int c_local;
  Renderer *this_local;
  
  this->channel[c].volume = 'd';
  this->channel[c].expression = '\x7f';
  this->channel[c].sustain = 0;
  this->channel[c].pitchbend = 0x2000;
  this->channel[c].pitchfactor = 0.0;
  this->channel[c].mono = 0;
  this->channel[c].rpn = 0x3fff;
  this->channel[c].nrpn = 0x3fff;
  return;
}

Assistant:

void Renderer::reset_controllers(int c)
{
	channel[c].volume = 100;
	channel[c].expression = 127;
	channel[c].sustain = 0;
	channel[c].pitchbend = 0x2000;
	channel[c].pitchfactor = 0; /* to be computed */
	channel[c].mono = 0;
	channel[c].rpn = RPN_RESET;
	channel[c].nrpn = RPN_RESET;
}